

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O2

int __thiscall
btDbvt::clone(btDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  btDbvtNode *pbVar1;
  btDbvtNode *parent;
  btScalar bVar2;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  btScalar bVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  btDbvtNode *pbVar9;
  btDbvtNode **ppbVar10;
  int iVar11;
  btAlignedObjectArray<btDbvt::sStkCLN> stack;
  sStkCLN local_68;
  long *local_58;
  btAlignedObjectArray<btDbvt::sStkCLN> local_50;
  
  local_58 = (long *)__child_stack;
  clear((btDbvt *)__fn);
  iVar11 = extraout_EAX;
  if (this->m_root != (btDbvtNode *)0x0) {
    local_50.m_ownsMemory = true;
    local_50.m_data = (sStkCLN *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    btAlignedObjectArray<btDbvt::sStkCLN>::reserve(&local_50,this->m_leaves);
    local_68.node = this->m_root;
    local_68.parent = (btDbvtNode *)0x0;
    btAlignedObjectArray<btDbvt::sStkCLN>::push_back(&local_50,&local_68);
    iVar11 = local_50.m_size;
    do {
      pbVar1 = local_50.m_data[(long)iVar11 + -1].node;
      parent = local_50.m_data[(long)iVar11 + -1].parent;
      pbVar9 = createnode((btDbvt *)__fn,parent,(pbVar1->field_2).data);
      bVar2 = (pbVar1->volume).mi.m_floats[0];
      bVar3 = (pbVar1->volume).mi.m_floats[1];
      bVar4 = (pbVar1->volume).mi.m_floats[2];
      bVar5 = (pbVar1->volume).mi.m_floats[3];
      bVar6 = (pbVar1->volume).mx.m_floats[1];
      bVar7 = (pbVar1->volume).mx.m_floats[2];
      bVar8 = (pbVar1->volume).mx.m_floats[3];
      (pbVar9->volume).mx.m_floats[0] = (pbVar1->volume).mx.m_floats[0];
      (pbVar9->volume).mx.m_floats[1] = bVar6;
      (pbVar9->volume).mx.m_floats[2] = bVar7;
      (pbVar9->volume).mx.m_floats[3] = bVar8;
      (pbVar9->volume).mi.m_floats[0] = bVar2;
      (pbVar9->volume).mi.m_floats[1] = bVar3;
      (pbVar9->volume).mi.m_floats[2] = bVar4;
      (pbVar9->volume).mi.m_floats[3] = bVar5;
      local_50.m_size = local_50.m_size + -1;
      ppbVar10 = (btDbvtNode **)((long)(&parent->volume + 1) + ((ulong)(iVar11 - 1U & 1) + 1) * 8);
      if (parent == (btDbvtNode *)0x0) {
        ppbVar10 = (btDbvtNode **)__fn;
      }
      *ppbVar10 = pbVar9;
      if ((pbVar1->field_2).childs[1] == (btDbvtNode *)0x0) {
        (**(code **)(*local_58 + 0x10))(local_58,pbVar9);
      }
      else {
        local_68.node = (pbVar1->field_2).childs[0];
        local_68.parent = pbVar9;
        btAlignedObjectArray<btDbvt::sStkCLN>::push_back(&local_50,&local_68);
        local_68.node = (pbVar1->field_2).childs[1];
        local_68.parent = pbVar9;
        btAlignedObjectArray<btDbvt::sStkCLN>::push_back(&local_50,&local_68);
      }
      iVar11 = local_50.m_size;
    } while (0 < local_50.m_size);
    btAlignedObjectArray<btDbvt::sStkCLN>::~btAlignedObjectArray(&local_50);
    iVar11 = extraout_EAX_00;
  }
  return iVar11;
}

Assistant:

void			btDbvt::clone(btDbvt& dest,IClone* iclone) const
{
	dest.clear();
	if(m_root!=0)
	{	
		btAlignedObjectArray<sStkCLN>	stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root,0));
		do	{
			const int		i=stack.size()-1;
			const sStkCLN	e=stack[i];
			btDbvtNode*			n=createnode(&dest,e.parent,e.node->volume,e.node->data);
			stack.pop_back();
			if(e.parent!=0)
				e.parent->childs[i&1]=n;
			else
				dest.m_root=n;
			if(e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0],n));
				stack.push_back(sStkCLN(e.node->childs[1],n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while(stack.size()>0);
	}
}